

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O1

int lib::table::Pack(State *state)

{
  size_t index;
  uint uVar1;
  Table *this;
  Value *value;
  size_t sVar2;
  StackAPI api;
  StackAPI local_30;
  
  luna::StackAPI::StackAPI(&local_30,state);
  this = luna::State::NewTable(state);
  uVar1 = luna::StackAPI::GetStackSize(&local_30);
  if (0 < (int)uVar1) {
    sVar2 = 0;
    do {
      index = sVar2 + 1;
      value = luna::StackAPI::GetValue(&local_30,(int)sVar2);
      luna::Table::SetArrayValue(this,index,value);
      sVar2 = index;
    } while (uVar1 != index);
  }
  luna::StackAPI::PushTable(&local_30,this);
  return 1;
}

Assistant:

int Pack(luna::State *state)
    {
        luna::StackAPI api(state);

        auto table = state->NewTable();
        auto params = api.GetStackSize();
        for (int i = 0; i < params; ++i)
            table->SetArrayValue(i + 1, *api.GetValue(i));

        api.PushTable(table);
        return 1;
    }